

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_object.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  memset(item,0,0x40);
  UnityBegin(
            "/workspace/llm4binary/github/license_c_cmakelists/DaveGamble[P]cJSON/tests/parse_object.c"
            );
  UnityDefaultTestRun(parse_object_should_parse_empty_objects,
                      "parse_object_should_parse_empty_objects",0xab);
  UnityDefaultTestRun(parse_object_should_not_parse_non_objects,
                      "parse_object_should_not_parse_non_objects",0xac);
  UnityDefaultTestRun(parse_object_should_parse_objects_with_multiple_elements,
                      "parse_object_should_parse_objects_with_multiple_elements",0xad);
  UnityDefaultTestRun(parse_object_should_parse_objects_with_one_element,
                      "parse_object_should_parse_objects_with_one_element",0xae);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

main(void)
{
    /* initialize cJSON item */
    memset(item, 0, sizeof(cJSON));

    UNITY_BEGIN();
    RUN_TEST(parse_object_should_parse_empty_objects);
    RUN_TEST(parse_object_should_not_parse_non_objects);
    RUN_TEST(parse_object_should_parse_objects_with_multiple_elements);
    RUN_TEST(parse_object_should_parse_objects_with_one_element);
    return UNITY_END();
}